

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm_lib.c
# Opt level: O3

void libdef_name(char *p,int kind)

{
  uint8_t *__dest;
  char cVar1;
  size_t sVar2;
  int iVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  int iVar7;
  size_t __n;
  FILE *__stream;
  char *pcVar8;
  char *pcVar9;
  ulong uVar10;
  char *pcVar11;
  dasm_State *pdVar12;
  int extraout_EDX;
  dasm_State *__s;
  uint uVar13;
  int *__s_00;
  uint uVar14;
  BuildCtx *ctx;
  uint *puVar15;
  BuildCtx *pBVar16;
  uint uVar17;
  uint uVar18;
  uint32_t uVar19;
  uint8_t *puVar20;
  ulong uVar21;
  bool bVar22;
  char *pcStack_81c0;
  int iStack_8160;
  short sStack_815c;
  char cStack_815a;
  char cStack_8159;
  undefined1 auStack_8158 [248];
  char *apcStack_8060 [4097];
  BuildCtx *pBStack_58;
  
  __s_00 = (int *)(ulong)(uint)kind;
  ctx = (BuildCtx *)p;
  iVar7 = kind;
  __n = strlen(p);
  sVar2 = modnamelen;
  if (((kind != 0xc0) && (modnamelen < __n)) && (p[modnamelen] == '_')) {
    iVar7 = 0x118200;
    ctx = (BuildCtx *)p;
    iVar3 = strncmp(p,modname,modnamelen);
    if (iVar3 == 0) {
      p = p + sVar2 + 1;
      __n = __n - (sVar2 + 1);
    }
  }
  if (__n < 0x3a) {
    if (optr + __n + 3 < (uint8_t *)((long)&optr + 1U)) {
      __dest = optr + 1;
      puVar20 = optr + __n + 1;
      *optr = (byte)kind | (byte)__n;
      memcpy(__dest,p,__n);
      optr = puVar20;
      return;
    }
  }
  else {
    ctx = (BuildCtx *)p;
    libdef_name_cold_2();
  }
  libdef_name_cold_1();
  pBVar16 = (BuildCtx *)*ctx->args;
  pBStack_58 = (BuildCtx *)p;
  if (pBVar16 == (BuildCtx *)0x0) {
LAB_0010b0ca:
    emit_fold_cold_6();
  }
  else {
    if ((*(char *)&pBVar16->D == '-') &&
       (__stream = _stdin, *(char *)((long)&pBVar16->D + 1) == '\0')) {
LAB_0010ad68:
      fwrite("/* This is a generated file. DO NOT EDIT! */\n\n",0x2e,1,(FILE *)ctx->fp);
      fwrite("static const FoldFunc fold_func[] = {\n",0x26,1,(FILE *)ctx->fp);
      lineno = 0;
      funcidx = 0;
      nkeys = 0;
      pcVar8 = fgets((char *)&iStack_8160,0x100,__stream);
      pcVar9 = (char *)ctx;
      if (pcVar8 != (char *)0x0) {
        __s_00 = &iStack_8160;
        do {
          lineno = lineno + 1;
          if (sStack_815c == 0x444c && iStack_8160 == 0x4f464a4c) {
            pcVar9 = strchr(&cStack_815a,0x29);
            if (pcVar9 == (char *)0x0 || cStack_815a != '(') {
              if (((cStack_815a != 'X') && (cStack_815a != 'F')) ||
                 ((cStack_8159 != '(' || (pcVar9 == (char *)0x0)))) {
LAB_0010b0b3:
                iVar7 = (int)&cStack_815a;
                emit_fold_cold_2();
                goto LAB_0010b0c5;
              }
              *pcVar9 = '\0';
              if (funcidx != 0) {
                fwrite(",\n",2,1,(FILE *)ctx->fp);
              }
              pcVar9 = "  fold_%s";
              if (cStack_815a == 'X') {
                pcVar9 = "  %s";
              }
              fprintf((FILE *)ctx->fp,pcVar9,auStack_8158);
              funcidx = funcidx + 1;
              pBVar16 = ctx;
            }
            else {
              *pcVar9 = '\0';
              apcStack_8060[0] = &cStack_8159;
              uVar4 = nexttoken(apcStack_8060,0,0);
              pBVar16 = (BuildCtx *)(ulong)uVar4;
              uVar5 = nexttoken(apcStack_8060,0,0x7f);
              iVar7 = 1;
              uVar6 = nexttoken(apcStack_8060,1,0x3ff);
              uVar19 = nkeys;
              iVar3 = funcidx;
              uVar10 = (ulong)nkeys;
              if (0xfff < uVar10) {
LAB_0010b0c5:
                emit_fold_cold_4();
                goto LAB_0010b0ca;
              }
              pBVar16 = (BuildCtx *)(ulong)(uVar4 << 0x11);
              uVar18 = uVar5 << 10 | uVar4 << 0x11 | uVar6;
              if (uVar10 == 0) {
                uVar13 = 0;
              }
              else {
                uVar14 = uVar18 & 0xffffff;
                puVar15 = foldkeys + uVar10;
                do {
                  uVar13 = (uint)uVar10;
                  uVar17 = foldkeys[uVar13 - 1] & 0xffffff;
                  if (uVar17 < uVar14) goto LAB_0010af85;
                  if (uVar17 == uVar14) {
                    emit_fold_cold_3();
                    goto LAB_0010b0b3;
                  }
                  *puVar15 = foldkeys[uVar13 - 1];
                  puVar15 = puVar15 + -1;
                  uVar10 = uVar10 - 1;
                } while ((ulong)(uVar13 - 1) != 0);
                uVar13 = 0;
              }
LAB_0010af85:
              foldkeys[uVar13] = uVar18 | iVar3 << 0x18;
              nkeys = uVar19 + 1;
            }
          }
          pcVar8 = fgets((char *)__s_00,0x100,__stream);
          pcVar9 = (char *)foldkeys;
        } while (pcVar8 != (char *)0x0);
      }
      fclose(__stream);
      fwrite("\n};\n\n",5,1,(FILE *)ctx->fp);
      uVar19 = nkeys;
      if (nkeys < 0x2000) {
        pcVar9 = "#define fold_hashkey(k)\t(lj_rol(lj_rol((k),%u)-(k),%u)%%%u)\n\n";
        uVar18 = nkeys | 1;
        do {
          __s_00 = (int *)0x0;
          do {
            iVar7 = tryhash((uint32_t *)apcStack_8060,uVar18,(uint32_t)__s_00,0);
            pBVar16 = (BuildCtx *)"#define fold_hashkey(k)\t(((((k)<<%u)-(k))<<%u)%%%u)\n\n";
            uVar19 = uVar18;
            if (iVar7 != 0) goto LAB_0010b05a;
            uVar13 = (uint32_t)__s_00 + 1;
            __s_00 = (int *)(ulong)uVar13;
          } while (uVar13 != 0x400);
          __s_00 = (int *)0x0;
          do {
            iVar7 = tryhash((uint32_t *)apcStack_8060,uVar18,(uint32_t)__s_00,1);
            pBVar16 = (BuildCtx *)pcVar9;
            if (iVar7 != 0) goto LAB_0010b05a;
            uVar13 = (uint32_t)__s_00 + 1;
            __s_00 = (int *)(ulong)uVar13;
          } while (uVar13 != 0x400);
          uVar19 = uVar18 + 2;
          bVar22 = uVar18 < 0x1ffe;
          uVar18 = uVar19;
        } while (bVar22);
      }
      emit_fold_cold_5();
      pBVar16 = (BuildCtx *)pcVar9;
LAB_0010b05a:
      printhash(ctx,(uint32_t *)apcStack_8060,uVar19);
      fprintf((FILE *)ctx->fp,(char *)pBVar16,(ulong)__s_00 >> 5 & 0x7ffffff,
              (ulong)((uint)__s_00 & 0x1f),(ulong)uVar19);
      return;
    }
    iVar7 = 0x110bed;
    __stream = fopen64((char *)pBVar16,"r");
    if (__stream != (FILE *)0x0) goto LAB_0010ad68;
  }
  emit_fold_cold_1();
  __s = pBVar16->D;
  if (__s != (dasm_State *)0x0) {
    pcVar9 = strchr((char *)__s,0x20);
    if (pcVar9 == (char *)0x0) {
      pdVar12 = (dasm_State *)0x0;
    }
    else {
      pdVar12 = (dasm_State *)(pcVar9 + 1);
      *pcVar9 = '\0';
    }
    pBVar16->D = pdVar12;
    if (iVar7 != 0) {
      iVar7 = strncmp((char *)__s,"IRFPM_",6);
      if (iVar7 == 0) {
        pcVar9 = "FLOOR";
        uVar10 = 0;
        do {
          iVar7 = strcmp(pcVar9,(char *)((long)&__s->psize + 6));
          if (iVar7 == 0) {
            return;
          }
          uVar10 = (ulong)((int)uVar10 + 1);
          pcVar9 = irfpm_names[uVar10];
        } while (pcVar9 != (char *)0x0);
        goto LAB_0010b2cd;
      }
      iVar7 = strncmp((char *)__s,"IRFL_",5);
      if (iVar7 == 0) {
        pcVar9 = "STR_LEN";
        uVar10 = 0;
        do {
          iVar7 = strcmp(pcVar9,(char *)((long)&__s->psize + 5));
          if (iVar7 == 0) {
            return;
          }
          uVar10 = (ulong)((int)uVar10 + 1);
          pcVar9 = irfield_names[uVar10];
        } while (pcVar9 != (char *)0x0);
        goto LAB_0010b2cd;
      }
      iVar7 = strncmp((char *)__s,"IRCALL_",7);
      if (iVar7 == 0) {
        pcVar9 = "lj_str_cmp";
        uVar10 = 0;
        do {
          iVar7 = strcmp(pcVar9,(char *)((long)&__s->psize + 7));
          if (iVar7 == 0) {
            return;
          }
          uVar10 = (ulong)((int)uVar10 + 1);
          pcVar9 = ircall_names[uVar10];
        } while (pcVar9 != (char *)0x0);
        goto LAB_0010b2cd;
      }
      iVar7 = strncmp((char *)__s,"IRCONV_",7);
      if (iVar7 == 0) goto LAB_0010b2d5;
      if ((byte)((char)__s->psize - 0x30U) < 10) {
        do {
          cVar1 = *(char *)((long)&__s->psize + 1);
          __s = (dasm_State *)((long)&__s->psize + 1);
        } while ((byte)(cVar1 - 0x30U) < 10);
        if (cVar1 == '\0') {
          return;
        }
        goto LAB_0010b2cd;
      }
    }
    if ((extraout_EDX == 0) || (iVar7 = strcmp("any",(char *)__s), iVar7 != 0)) {
      pcVar9 = "LT";
      uVar10 = 0;
      do {
        iVar7 = strcmp(pcVar9,(char *)__s);
        if (iVar7 == 0) {
          return;
        }
        uVar10 = (ulong)((int)uVar10 + 1);
        pcVar9 = ir_names[uVar10];
      } while (pcVar9 != (char *)0x0);
LAB_0010b2cd:
      do {
        nexttoken_cold_1();
LAB_0010b2d5:
        pcVar8 = "NIL";
        pcVar9 = (char *)((long)&__s->psize + 7);
        pcVar11 = strchr(pcVar9,0x5f);
        pcStack_81c0 = "NIL";
        uVar10 = 0;
        do {
          if ((pcVar11 != (char *)0x0) &&
             (iVar7 = strncmp(pcVar8,pcVar9,(long)pcVar11 - (long)pcVar9), iVar7 == 0)) {
            uVar21 = 1;
            pcVar8 = pcStack_81c0;
            do {
              iVar7 = strcmp(pcVar8,pcVar11 + 1);
              if (iVar7 == 0) {
                return;
              }
              pcVar8 = irt_names[uVar21];
              uVar21 = (ulong)((int)uVar21 + 1);
            } while (pcVar8 != (char *)0x0);
          }
          uVar10 = (ulong)((int)uVar10 + 1);
          pcVar8 = irt_names[uVar10];
        } while (pcVar8 != (char *)0x0);
      } while( true );
    }
  }
  return;
}

Assistant:

static void libdef_name(const char *p, int kind)
{
  size_t n = strlen(p);
  if (kind != LIBINIT_STRING) {
    if (n > modnamelen && p[modnamelen] == '_' &&
	!strncmp(p, modname, modnamelen)) {
      p += modnamelen+1;
      n -= modnamelen+1;
    }
  }
  if (n > LIBINIT_MAXSTR) {
    fprintf(stderr, "Error: string too long: '%s'\n",  p);
    exit(1);
  }
  if (optr+1+n+2 > obuf+sizeof(obuf)) {  /* +2 for caller. */
    fprintf(stderr, "Error: output buffer overflow\n");
    exit(1);
  }
  *optr++ = (uint8_t)(n | kind);
  memcpy(optr, p, n);
  optr += n;
}